

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

Optional<Catch::ColourMode> Catch::Detail::stringToColourMode(StringRef colourMode)

{
  bool bVar1;
  ColourMode *pCVar2;
  ColourMode CVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar4;
  ColourMode *pCVar5;
  StringRef other;
  StringRef other_00;
  StringRef other_01;
  StringRef other_02;
  Optional<Catch::ColourMode> OVar6;
  StringRef colourMode_local;
  
  colourMode_local.m_start = (char *)colourMode.m_size;
  pCVar5 = (ColourMode *)colourMode.m_start;
  other.m_size = 7;
  other.m_start = "default";
  bVar1 = StringRef::operator==(&colourMode_local,other);
  if (bVar1) {
    CVar3 = PlatformDefault;
    uVar4 = extraout_RDX;
  }
  else {
    other_00.m_size = 4;
    other_00.m_start = "ansi";
    bVar1 = StringRef::operator==(&colourMode_local,other_00);
    CVar3 = ANSI;
    uVar4 = extraout_RDX_00;
    if (!bVar1) {
      other_01.m_size = 5;
      other_01.m_start = "win32";
      bVar1 = StringRef::operator==(&colourMode_local,other_01);
      CVar3 = Win32;
      uVar4 = extraout_RDX_01;
      if (!bVar1) {
        other_02.m_size = 4;
        other_02.m_start = "none";
        bVar1 = StringRef::operator==(&colourMode_local,other_02);
        CVar3 = None;
        uVar4 = extraout_RDX_02;
        if (!bVar1) {
          pCVar2 = (ColourMode *)0x0;
          goto LAB_00155253;
        }
      }
    }
  }
  pCVar2 = pCVar5 + 8;
  pCVar5[8] = CVar3;
LAB_00155253:
  *(ColourMode **)pCVar5 = pCVar2;
  OVar6._8_8_ = uVar4;
  OVar6.nullableValue = pCVar5;
  return OVar6;
}

Assistant:

Optional<ColourMode> stringToColourMode( StringRef colourMode ) {
            if ( colourMode == "default" ) {
                return ColourMode::PlatformDefault;
            } else if ( colourMode == "ansi" ) {
                return ColourMode::ANSI;
            } else if ( colourMode == "win32" ) {
                return ColourMode::Win32;
            } else if ( colourMode == "none" ) {
                return ColourMode::None;
            } else {
                return {};
            }
        }